

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O2

monster_race * get_mon_num(wchar_t generated_level,wchar_t current_level)

{
  short sVar1;
  locality lVar2;
  topography tVar3;
  level_conflict *plVar4;
  char *pcVar5;
  alloc_entry *table;
  _Bool _Var6;
  uint32_t uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  tm *ptVar12;
  monster_race *pmVar13;
  monster_race *pmVar14;
  monster_race *old;
  bitflag *flags;
  int *piVar15;
  long lVar16;
  long local_48;
  time_t local_38;
  
  table = alloc_race_table;
  if ((L'\0' < generated_level) && (uVar7 = Rand_div((uint)z_info->ood_monster_chance), uVar7 == 0))
  {
    uVar8 = ((uint)generated_level >> 2) + 2;
    if (z_info->ood_monster_amount <= uVar8) {
      uVar8 = (uint)z_info->ood_monster_amount;
    }
    generated_level = generated_level + uVar8;
  }
  lVar16 = 0;
  local_48 = 0;
  for (piVar15 = &table->prob3; (lVar16 < alloc_race_size && (piVar15[-3] <= generated_level));
      piVar15 = piVar15 + 5) {
    *piVar15 = 0;
    pmVar13 = r_info;
    if ((generated_level < L'\x01') || (L'\0' < piVar15[-3])) {
      iVar11 = ((alloc_entry *)(piVar15 + -4))->index;
      local_38 = time((time_t *)0x0);
      ptVar12 = localtime(&local_38);
      sVar1 = player->place;
      plVar4 = world->levels;
      flags = pmVar13[iVar11].flags;
      _Var6 = flag_has_dbg(flags,0xc,0xf,"race->flags","RF_SEASONAL");
      if ((!_Var6) || ((ptVar12->tm_mon == 0xb && (ptVar12->tm_mday - 0x18U < 3)))) {
        _Var6 = flag_has_dbg(flags,0xc,1,"race->flags","RF_UNIQUE");
        if ((((((!_Var6) || (pmVar13[iVar11].cur_num < (int)(uint)pmVar13[iVar11].max_num)) &&
              ((_Var6 = flag_has_dbg(flags,0xc,0xc,"race->flags","RF_FORCE_DEPTH"), !_Var6 ||
               (pmVar13[iVar11].level <= (int)player->depth)))) &&
             ((_Var6 = flag_has_dbg(flags,0xc,0x14,"race->flags","RF_ANGBAND"), !_Var6 ||
              (plVar4[sVar1].locality == LOC_ANGBAND)))) &&
            ((iVar9 = strcmp(world->name,"Angband Dungeon"), iVar9 == 0 ||
             ((((_Var6 = flag_has_dbg(flags,0xc,0x10,"race->flags","RF_AMON_RUDH"), !_Var6 ||
                (plVar4[sVar1].locality == LOC_AMON_RUDH)) &&
               ((_Var6 = flag_has_dbg(flags,0xc,0x11,"race->flags","RF_NARGOTHROND"), !_Var6 ||
                (plVar4[sVar1].locality == LOC_NARGOTHROND)))) &&
              (((_Var6 = flag_has_dbg(flags,0xc,0x12,"race->flags","RF_DUNGORTHEB"), !_Var6 ||
                (plVar4[sVar1].locality == LOC_NAN_DUNGORTHEB)) &&
               ((_Var6 = flag_has_dbg(flags,0xc,0x13,"race->flags","RF_GAURHOTH"), !_Var6 ||
                (plVar4[sVar1].locality == LOC_TOL_IN_GAURHOTH)))))))))) &&
           (((_Var6 = flag_has_dbg(flags,0xc,0x15,"race->flags","RF_DUNGEON"), !_Var6 ||
             (plVar4[sVar1].topography == TOP_CAVE)) &&
            ((_Var6 = flag_has_dbg(flags,0xc,0x22,"race->flags","RF_FLYING"), _Var6 ||
             (plVar4[sVar1].topography != TOP_MOUNTAINTOP)))))) {
          iVar9 = piVar15[-1];
          *piVar15 = iVar9;
          plVar4 = world->levels;
          sVar1 = player->place;
          lVar2 = plVar4[sVar1].locality;
          if (lVar2 == LOC_TOL_IN_GAURHOTH) {
            iVar10 = strcmp((pmVar13[iVar11].base)->name,"wolf");
            if (iVar10 == 0) {
              iVar9 = iVar9 << 2;
            }
            else {
              _Var6 = flag_has_dbg(flags,0xc,0x49,"race->flags","RF_UNDEAD");
              iVar9 = iVar9 << _Var6;
            }
          }
          else if (lVar2 == LOC_NAN_DUNGORTHEB) {
            pcVar5 = (pmVar13[iVar11].base)->name;
            iVar10 = strcmp(pcVar5,"spider");
            if (iVar10 == 0) {
              iVar9 = iVar9 * 5;
            }
            else {
              iVar10 = strcmp(pcVar5,"person");
              if ((iVar10 == 0) || (iVar10 = strcmp(pcVar5,"humanoid"), iVar10 == 0)) {
                iVar9 = iVar9 / 3;
              }
            }
          }
          tVar3 = plVar4[sVar1].topography;
          if (tVar3 == TOP_FOREST) {
            iVar10 = strcmp((pmVar13[iVar11].base)->name,"reptile");
            if (iVar10 == 0) {
              iVar9 = iVar9 / 2;
            }
            else {
              _Var6 = flag_has_dbg(flags,0xc,0x47,"race->flags","RF_ANIMAL");
              if (_Var6) {
                iVar11 = strcmp((pmVar13[iVar11].base)->name,"zephyr hound");
                iVar9 = iVar9 << (iVar11 != 0);
              }
            }
          }
          else if ((tVar3 == TOP_DESERT) || (tVar3 == TOP_MOUNTAIN)) {
            pcVar5 = (pmVar13[iVar11].base)->name;
            iVar11 = strcmp(pcVar5,"reptile");
            if ((iVar11 == 0) ||
               ((iVar11 = strcmp(pcVar5,"snake"), iVar11 == 0 ||
                (iVar11 = strcmp(pcVar5,"centipede"), iVar11 == 0)))) {
              iVar9 = iVar9 * 2;
            }
            else {
              _Var6 = flag_has_dbg(flags,0xc,0x47,"race->flags","RF_ANIMAL");
              if (_Var6) {
                iVar9 = iVar9 / 2;
              }
            }
          }
          *piVar15 = iVar9;
          local_48 = local_48 + iVar9;
        }
      }
    }
    lVar16 = lVar16 + 1;
  }
  if (local_48 < 1) {
    pmVar13 = (monster_race *)0x0;
  }
  else {
    pmVar13 = get_mon_race_aux(local_48,table);
    uVar7 = Rand_div(100);
    if ((int)uVar7 < 0x3c) {
      pmVar14 = get_mon_race_aux(local_48,table);
      if (pmVar13->level <= pmVar14->level) {
        pmVar13 = pmVar14;
      }
      if (((int)uVar7 < 10) &&
         (pmVar14 = get_mon_race_aux(local_48,table), pmVar13->level <= pmVar14->level)) {
        pmVar13 = pmVar14;
      }
    }
  }
  return pmVar13;
}

Assistant:

struct monster_race *get_mon_num(int generated_level, int current_level)
{
	int i, p;
	long total;
	struct monster_race *race;
	alloc_entry *table = alloc_race_table;

	/* Occasionally produce a nastier monster in the dungeon */
	if (generated_level > 0 && one_in_(z_info->ood_monster_chance))
		generated_level += MIN(generated_level / 4 + 2,
			z_info->ood_monster_amount);

	total = 0L;

	/* Process probabilities */
	for (i = 0; i < alloc_race_size; i++) {
		/* Monsters are sorted by depth */
		if (table[i].level > generated_level) break;

		/* Default */
		table[i].prob3 = 0;

		/* No town monsters in dungeon */
		if (generated_level > 0 && table[i].level <= 0) continue;

		/* Get the chosen monster */
		race = &r_info[table[i].index];

		/* Some monsters will not be allowed on the current level */
		if (get_mon_forbidden(race)) continue;

		/* Accept */
		table[i].prob3 = table[i].prob2;

		/* Adjust for locality and topography */
		table[i].prob3 = get_mon_adjust(table[i].prob3, race);

		/* Total */
		total += table[i].prob3;
	}

	/* No legal monsters */
	if (total <= 0) return NULL;

	/* Pick a monster */
	race = get_mon_race_aux(total, table);

	/* Try for a "harder" monster once (50%) or twice (10%) */
	p = randint0(100);

	if (p < 60) {
		struct monster_race *old = race;

		/* Pick a new monster */
		race = get_mon_race_aux(total, table);

		/* Keep the deepest one */
		if (race->level < old->level) race = old;
	}

	/* Try for a "harder" monster twice (10%) */
	if (p < 10) {
		struct monster_race *old = race;

		/* Pick a monster */
		race = get_mon_race_aux(total, table);

		/* Keep the deepest one */
		if (race->level < old->level) race = old;
	}

	/* Result */
	return race;
}